

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O3

ActionResult * __thiscall
Shell::doAction(ActionResult *__return_storage_ptr__,Shell *this,Action *act)

{
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  *this_00;
  __index_type _Var1;
  mapped_type *pmVar2;
  iterator iVar3;
  Name *__k;
  Literals local_68;
  
  this_00 = &this->instances;
  __k = &this->lastModule;
  pmVar2 = std::
           map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
           ::operator[](this_00,__k);
  if ((pmVar2->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("instances[lastModule].get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                  ,0xd1,"ActionResult Shell::doAction(Action &)");
  }
  _Var1 = (act->super__Variant_base<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>).
          super__Move_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>.
          super__Copy_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>.
          super__Move_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>.
          super__Copy_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>.
          super__Variant_storage_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>.
          _M_index;
  if (_Var1 == '\x01') {
    if (*(char *)((long)&(act->
                         super__Variant_base<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         ).
                         super__Move_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         .
                         super__Copy_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         .
                         super__Move_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         .
                         super__Variant_storage_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         ._M_u + 0x10) != '\0') {
      __k = (Name *)act;
    }
    iVar3 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
            ::find(&this_00->_M_t,__k);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->instances)._M_t._M_impl.super__Rb_tree_header)
    goto LAB_00143087;
    wasm::ModuleRunnerBase<wasm::ModuleRunner>::getExport
              (&local_68,(ModuleRunnerBase<wasm::ModuleRunner> *)iVar3._M_node[1]._M_left,
               (Name)((IString *)
                     ((long)&(act->
                             super__Variant_base<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             ).
                             super__Move_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             .
                             super__Copy_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             .
                             super__Move_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             .
                             super__Variant_storage_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             ._M_u + 0x18))->str);
    *(size_t *)
     &(__return_storage_ptr__->
      super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      ).
      super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      ._M_u = local_68.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    wasm::Literal::Literal
              ((Literal *)
               ((long)&(__return_storage_ptr__->
                       super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       ).
                       super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       .
                       super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       .
                       super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       .
                       super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       .
                       super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       ._M_u + 8),local_68.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
  }
  else {
    if (_Var1 != '\0') {
      wasm::handle_unreachable
                ("unexpected action",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                 ,0xf1);
    }
    if (*(char *)((long)&(act->
                         super__Variant_base<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         ).
                         super__Move_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         .
                         super__Copy_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         .
                         super__Move_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         .
                         super__Variant_storage_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         ._M_u + 0x10) != '\0') {
      __k = (Name *)act;
    }
    iVar3 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
            ::find(&this_00->_M_t,__k);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->instances)._M_t._M_impl.super__Rb_tree_header) {
LAB_00143087:
      (__return_storage_ptr__->
      super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      ).
      super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      ._M_index = '\x01';
      return __return_storage_ptr__;
    }
    wasm::ModuleRunnerBase<wasm::ModuleRunner>::callExport
              (&local_68,(ModuleRunnerBase<wasm::ModuleRunner> *)iVar3._M_node[1]._M_left,
               (Name)((IString *)
                     ((long)&(act->
                             super__Variant_base<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             ).
                             super__Move_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             .
                             super__Copy_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             .
                             super__Move_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             .
                             super__Variant_storage_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                             ._M_u + 0x18))->str,
               (Literals *)
               ((long)&(act->
                       super__Variant_base<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       ).
                       super__Move_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       .
                       super__Copy_assign_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       .
                       super__Move_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       .
                       super__Variant_storage_alias<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                       ._M_u + 0x28));
    *(size_t *)
     &(__return_storage_ptr__->
      super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      ).
      super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      .
      super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
      ._M_u = local_68.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    wasm::Literal::Literal
              ((Literal *)
               ((long)&(__return_storage_ptr__->
                       super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       ).
                       super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       .
                       super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       .
                       super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       .
                       super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       .
                       super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
                       ._M_u + 8),local_68.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
  }
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           ).
           super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           ._M_u + 0x20) =
       local_68.super_SmallVector<wasm::Literal,_1UL>.flexible.
       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           ).
           super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           ._M_u + 0x28) =
       local_68.super_SmallVector<wasm::Literal,_1UL>.flexible.
       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           ).
           super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           .
           super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
           ._M_u + 0x30) =
       local_68.super_SmallVector<wasm::Literal,_1UL>.flexible.
       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Variant_base<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  ).
  super__Move_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  .
  super__Copy_assign_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  .
  super__Move_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  .
  super__Copy_ctor_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  .
  super__Variant_storage_alias<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  ._M_index = '\0';
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            (&local_68.super_SmallVector<wasm::Literal,_1UL>.flexible);
  wasm::Literal::~Literal(local_68.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
  return __return_storage_ptr__;
}

Assistant:

ActionResult doAction(Action& act) {
    assert(instances[lastModule].get());
    if (auto* invoke = std::get_if<InvokeAction>(&act)) {
      auto it = instances.find(invoke->base ? *invoke->base : lastModule);
      if (it == instances.end()) {
        return TrapResult{};
      }
      auto& instance = it->second;
      try {
        return instance->callExport(invoke->name, invoke->args);
      } catch (TrapException&) {
        return TrapResult{};
      } catch (HostLimitException&) {
        return HostLimitResult{};
      } catch (WasmException&) {
        return ExceptionResult{};
      } catch (...) {
        WASM_UNREACHABLE("unexpected error");
      }
    } else if (auto* get = std::get_if<GetAction>(&act)) {
      auto it = instances.find(get->base ? *get->base : lastModule);
      if (it == instances.end()) {
        return TrapResult{};
      }
      auto& instance = it->second;
      try {
        return instance->getExport(get->name);
      } catch (TrapException&) {
        return TrapResult{};
      } catch (...) {
        WASM_UNREACHABLE("unexpected error");
      }
    } else {
      WASM_UNREACHABLE("unexpected action");
    }
  }